

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::WrapChild
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,string_view prefix,
          string_view postfix,Precedence precedence)

{
  ulong amount;
  const_iterator __position;
  size_t sVar1;
  ulong amount_00;
  pointer pbVar2;
  allocator<char> local_65;
  Precedence local_64;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  value_type local_50;
  
  amount_00 = prefix._M_len;
  local_64 = precedence;
  local_60._M_len = amount_00;
  local_60._M_str = prefix._M_str;
  sVar1 = Value::width(child);
  if ((sVar1 + amount_00 + postfix._M_len < this->target_exp_width) ||
     (amount = this->indent_amount, postfix._M_len <= amount && amount_00 <= amount)) {
    pbVar2 = (child->v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(child->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x20) {
      std::__cxx11::string::insert((ulong)pbVar2,(char *)0x0,(ulong)prefix._M_str);
      pbVar2 = (child->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00131e82;
    }
    IndentValue(this,child,amount_00,prefix);
  }
  else {
    IndentValue(this,child,amount,(string_view)ZEXT816(0));
    __position._M_current =
         (child->v).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_50,&local_60,&local_65);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&child->v,__position,&local_50);
    std::__cxx11::string::_M_dispose();
  }
  pbVar2 = (child->v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00131e82:
  std::__cxx11::string::append((char *)pbVar2,(ulong)postfix._M_str);
  child->precedence = local_64;
  Value::Value(__return_storage_ptr__,child);
  return __return_storage_ptr__;
}

Assistant:

Value WrapChild(Value& child,
                  std::string_view prefix,
                  std::string_view postfix,
                  Precedence precedence) {
    auto width = prefix.size() + postfix.size() + child.width();
    auto& v = child.v;
    if (width < target_exp_width ||
        (prefix.size() <= indent_amount && postfix.size() <= indent_amount)) {
      if (v.size() == 1) {
        // Fits in a single line.
        v[0].insert(0, prefix.data(), prefix.size());
        v[0].append(postfix.data(), postfix.size());
      } else {
        // Multiline, but with prefix on same line.
        IndentValue(child, prefix.size(), prefix);
        v.back().append(postfix.data(), postfix.size());
      }
    } else {
      // Multiline with prefix on its own line.
      IndentValue(child, indent_amount, {});
      v.insert(v.begin(), std::string(prefix));
      v.back().append(postfix.data(), postfix.size());
    }
    child.precedence = precedence;
    return std::move(child);
  }